

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall rtc::LogMessage::~LogMessage(LogMessage *this)

{
  pointer pcVar1;
  string *tag;
  LoggingSeverity severity;
  undefined8 *puVar2;
  CritScope cs;
  CritScope CStack_48;
  string local_40;
  
  if ((this->extra_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,(this->extra_)._M_dataplus._M_p,(this->extra_)._M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  std::ostream::put((char)this);
  std::ostream::flush();
  severity = (int)this + 8;
  std::__cxx11::stringbuf::str();
  if (dbg_sev_ <= (int)this->severity_) {
    OutputToDebug(&local_40,severity,tag);
  }
  CritScope::CritScope(&CStack_48,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  if ((undefined8 **)streams__abi_cxx11_ != &streams__abi_cxx11_) {
    puVar2 = streams__abi_cxx11_;
    do {
      if (*(int *)(puVar2 + 3) <= (int)this->severity_) {
        (**(code **)(*(long *)puVar2[2] + 0x10))((long *)puVar2[2],&local_40);
      }
      puVar2 = (undefined8 *)*puVar2;
    } while ((undefined8 **)puVar2 != &streams__abi_cxx11_);
  }
  CritScope::~CritScope(&CStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pcVar1 = (this->extra_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->extra_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->tag_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tag_).field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

LogMessage::~LogMessage() {
  if (!extra_.empty())
    print_stream_ << " : " << extra_;
  print_stream_ << std::endl;

  const std::string& str = print_stream_.str();
  if (severity_ >= dbg_sev_) {
    OutputToDebug(str, severity_, tag_);
  }

  CritScope cs(&g_log_crit);
  for (auto& kv : streams_) {
    if (severity_ >= kv.second) {
      kv.first->OnLogMessage(str);
    }
  }
}